

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_indexOf(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  bool *pbVar2;
  long lVar3;
  char *__s2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  ListStorage<MiniScript::TACLine> *pLVar10;
  undefined8 uVar11;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar12;
  int32_t iVar13;
  int iVar14;
  anon_union_8_3_2f476f46_for_data aVar15;
  _func_int **pp_Var16;
  Machine *pMVar17;
  Interpreter *pIVar18;
  long lVar19;
  size_t sVar20;
  size_t posB;
  ulong uVar21;
  size_t sVar22;
  Value *pVVar23;
  _func_int **pp_Var24;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  double dVar30;
  Value after;
  String s;
  Value self;
  ValueDict dict;
  Value value;
  anon_union_8_3_2f476f46_for_data local_108;
  RefCountedStorage *local_100;
  Context *local_f8;
  undefined1 local_f0 [8];
  anon_union_8_3_2f476f46_for_data local_e8;
  long *local_e0;
  anon_union_8_3_2f476f46_for_data local_d8;
  undefined1 local_d0 [16];
  ValueDict local_c0;
  Value local_a8;
  Value local_98;
  anon_union_8_3_2f476f46_for_data local_88;
  Machine *local_80;
  ValueType local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  bool local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  ListStorage<MiniScript::Value> *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  long *local_38;
  
  local_58 = false;
  aVar15.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar15.ref)->refCount = 1;
  (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
  aVar15.ref[1].refCount = 5;
  aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var16 = (_func_int **)operator_new__(5);
  aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
  *(undefined1 *)((long)pp_Var16 + 4) = 0;
  *(undefined4 *)pp_Var16 = 0x666c6573;
  local_60.ref = aVar15.ref;
  Context::GetVar((Context *)local_d0,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  if ((local_60.ref != (RefCountedStorage *)0x0) && (local_58 == false)) {
    plVar1 = &(local_60.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_60.ref)->_vptr_RefCountedStorage[1])();
    }
    local_60.number = 0.0;
  }
  local_68.tempNum._0_1_ = '\0';
  aVar15.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar15.ref)->refCount = 1;
  (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
  aVar15.ref[1].refCount = 6;
  aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var16 = (_func_int **)operator_new__(6);
  aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
  *(undefined2 *)((long)pp_Var16 + 4) = 0x65;
  *(undefined4 *)pp_Var16 = 0x756c6176;
  local_70.ref = aVar15.ref;
  Context::GetVar((Context *)&local_98,(String *)partialResult.rs,(LocalOnlyMode)&local_70);
  if ((local_70.ref != (RefCountedStorage *)0x0) && (local_68.tempNum._0_1_ == '\0')) {
    plVar1 = &(local_70.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_70.ref)->_vptr_RefCountedStorage[1])();
    }
    local_70.number = 0.0;
  }
  local_78 = Null;
  pMVar17 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar17->storeImplicit = 1;
  pMVar17->standardOutput = (TextOutputMethod)&PTR__StringStorage_001d10b0;
  *(undefined8 *)&pMVar17->yielding = 6;
  (pMVar17->functionType).type = ~Null;
  (pMVar17->functionType).noInvoke = true;
  (pMVar17->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar17->functionType).field_0x3 = 0xffffffffff;
  pIVar18 = (Interpreter *)operator_new__(6);
  pMVar17->interpreter = pIVar18;
  *(undefined2 *)((long)&pIVar18->_vptr_Interpreter + 4) = 0x72;
  *(undefined4 *)&pIVar18->_vptr_Interpreter = 0x65746661;
  local_80 = pMVar17;
  Context::GetVar((Context *)local_f0,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  if ((local_80 != (Machine *)0x0) && (local_78 == Null)) {
    pbVar2 = &local_80->storeImplicit;
    *(long *)pbVar2 = *(long *)pbVar2 + -1;
    if (*(long *)pbVar2 == 0) {
      (**(code **)(local_80->standardOutput + 8))();
    }
    local_80 = (Machine *)0x0;
  }
  uVar11 = local_d0._8_8_;
  if (local_d0[0] == String) {
    if ((StringStorage *)local_d0._8_8_ == (StringStorage *)0x0) {
      local_108.number = 0.0;
    }
    else {
      *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
      local_108 = (anon_union_8_3_2f476f46_for_data)local_d0._8_8_;
    }
    local_100 = (RefCountedStorage *)((ulong)local_100 & 0xffffffffffffff00);
    Value::ToString((Value *)&local_e0,(Machine *)&local_98);
    if (local_f0[0] == Null) {
      lVar19 = -1;
    }
    else {
      iVar13 = Value::IntValue((Value *)local_f0);
      lVar19 = (long)iVar13;
    }
    if (lVar19 < -1) {
      if ((StringStorage *)local_108.ref == (StringStorage *)0x0) {
        pp_Var16 = (_func_int **)0x0;
      }
      else {
        if ((long)local_108.ref[2]._vptr_RefCountedStorage < 0) {
          StringStorage::analyzeChars((StringStorage *)local_108.ref);
        }
        pp_Var16 = local_108.ref[2]._vptr_RefCountedStorage;
      }
      lVar19 = lVar19 + (long)pp_Var16;
    }
    sVar20 = String::bytePosOfCharPos((String *)&local_108,lVar19 + 1);
    sVar22 = 0xffffffffffffffff;
    posB = sVar22;
    if (((StringStorage *)local_108.ref != (StringStorage *)0x0) &&
       (posB = sVar20, local_e0 != (long *)0x0)) {
      lVar19 = local_e0[3];
      lVar26 = local_108.ref[1].refCount - lVar19;
      posB = sVar22;
      local_f8 = context;
      if ((long)sVar20 <= lVar26) {
        pp_Var16 = local_108.ref[1]._vptr_RefCountedStorage;
        __s2 = (char *)local_e0[2];
        do {
          iVar14 = strncmp((char *)((long)pp_Var16 + sVar20),__s2,lVar19 - 1);
          posB = sVar20;
          context = local_f8;
          if (iVar14 == 0) break;
          bVar28 = (long)sVar20 < lVar26;
          posB = sVar22;
          sVar20 = sVar20 + 1;
        } while (bVar28);
      }
    }
    if (0 < (long)posB) {
      posB = String::charPosOfBytePos((String *)&local_108,posB);
    }
    if (-1 < (long)posB) {
      local_48 = (ListStorage<MiniScript::Value> *)(double)(long)posB;
      local_50.tempNum._0_2_ = 1;
      local_50.tempNum._2_1_ = 0;
      ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3)
                       ,(Value *)&local_50);
      *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((2 < (byte)local_50.tempNum._0_1_) && (local_48 != (ListStorage<MiniScript::Value> *)0x0))
      {
        plVar1 = &(local_48->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(local_48->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_48 = (ListStorage<MiniScript::Value> *)0x0;
      }
      if ((local_e0 != (long *)0x0) && (local_d8.tempNum._0_1_ == '\0')) {
        plVar1 = local_e0 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*local_e0 + 8))();
        }
        local_e0 = (long *)0x0;
      }
      if (((StringStorage *)local_108.ref != (StringStorage *)0x0) && ((char)local_100 == '\0')) {
        plVar1 = &(local_108.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((RefCountedStorage *)&(local_108.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_108.number = 0.0;
      }
      goto LAB_00150220;
    }
    if ((local_e0 != (long *)0x0) && (local_d8.tempNum._0_1_ == '\0')) {
      plVar1 = local_e0 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*local_e0 + 8))();
      }
      local_e0 = (long *)0x0;
    }
    if (((StringStorage *)local_108.ref != (StringStorage *)0x0) && ((char)local_100 == '\0')) {
      plVar1 = &(local_108.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_108.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage
          [1])();
      }
      local_108.number = 0.0;
    }
  }
  else if (local_d0[0] == Map) {
    Value::GetDict(&local_c0,(Value *)local_d0);
    pDVar12 = local_c0.ds;
    bVar28 = local_f0[0] == Null;
    uVar27 = 0;
    if (local_c0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
LAB_0014fb8c:
      uVar27 = 0;
      pHVar25 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
    else {
      pHVar25 = (local_c0.ds)->mTable[0];
      if (pHVar25 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
        uVar27 = 0;
        do {
          uVar21 = uVar27;
          if (uVar21 == 0xfa) goto LAB_0014fb8c;
          uVar27 = uVar21 + 1;
        } while ((local_c0.ds)->mTable[uVar21 + 1] ==
                 (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0);
        pHVar25 = (local_c0.ds)->mTable[uVar21 + 1];
        if (0xf9 < uVar21) {
          pHVar25 = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0;
        }
        uVar27 = uVar21 + 1 & 0xffffffff;
      }
    }
    local_f8 = context;
    if (pHVar25 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
      do {
        if (bVar28) {
          pVVar23 = &pHVar25->value;
          uVar4 = pVVar23->type;
          uVar5 = pVVar23->noInvoke;
          uVar6 = pVVar23->localOnly;
          local_108.tempNum._2_1_ = uVar6;
          local_108.tempNum._1_1_ = uVar5;
          local_108.tempNum._0_1_ = uVar4;
          local_100 = (pHVar25->value).data.ref;
          if ((Temp < pVVar23->type) && (local_100 != (RefCountedStorage *)0x0)) {
            local_100->refCount = local_100->refCount + 1;
          }
          aVar15.number = Value::Equality((Value *)&local_108,&local_98,0x10);
          if ((2 < (byte)local_108.tempNum._0_1_) && (local_100 != (RefCountedStorage *)0x0)) {
            plVar1 = &local_100->refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              local_88.number = aVar15.number;
              (*local_100->_vptr_RefCountedStorage[1])();
              aVar15 = local_88;
            }
            local_100 = (RefCountedStorage *)0x0;
          }
          context = local_f8;
          if ((aVar15.number == 1.0) && (!NAN(aVar15.number))) {
            local_a8.type = (pHVar25->key).type;
            local_a8.noInvoke = (pHVar25->key).noInvoke;
            local_a8.localOnly = (pHVar25->key).localOnly;
            local_a8.data = (anon_union_8_3_2f476f46_for_data)(pHVar25->key).data.ref;
            if ((Temp < local_a8.type) && (local_a8.data.ref != (RefCountedStorage *)0x0)) {
              (local_a8.data.ref)->refCount = (local_a8.data.ref)->refCount + 1;
            }
            ((RefCountedStorage *)&local_f8->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
            IntrinsicResult::ensureStorage((IntrinsicResult *)local_f8);
            Value::operator=((Value *)(((RefCountedStorage *)&context->code)->
                                       _vptr_RefCountedStorage + 3),&local_a8);
            *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
            if ((2 < local_a8.type) && (local_a8.data.ref != (RefCountedStorage *)0x0)) {
              plVar1 = &(local_a8.data.ref)->refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(local_a8.data.ref)->_vptr_RefCountedStorage[1])();
              }
              local_a8.data.number = 0.0;
            }
            local_c0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
            if ((local_c0.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
               (local_c0.isTemp == false)) {
              plVar1 = &((local_c0.ds)->super_RefCountedStorage).refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*((local_c0.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
              }
              local_c0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
            }
            goto LAB_00150220;
          }
        }
        else {
          pVVar23 = &pHVar25->key;
          uVar7 = pVVar23->type;
          uVar8 = pVVar23->noInvoke;
          uVar9 = pVVar23->localOnly;
          local_108.tempNum._2_1_ = uVar9;
          local_108.tempNum._1_1_ = uVar8;
          local_108.tempNum._0_1_ = uVar7;
          local_100 = (pHVar25->key).data.ref;
          if ((Temp < pVVar23->type) && (local_100 != (RefCountedStorage *)0x0)) {
            local_100->refCount = local_100->refCount + 1;
          }
          aVar15.number = Value::Equality((Value *)&local_108,(Value *)local_f0,0x10);
          if ((2 < (byte)local_108.tempNum._0_1_) && (local_100 != (RefCountedStorage *)0x0)) {
            plVar1 = &local_100->refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              local_88.number = aVar15.number;
              (*local_100->_vptr_RefCountedStorage[1])();
              aVar15 = local_88;
            }
            local_100 = (RefCountedStorage *)0x0;
          }
          if ((aVar15.number == 1.0) && (!NAN(aVar15.number))) {
            bVar28 = true;
          }
        }
        pHVar25 = pHVar25->next;
        if (pHVar25 == (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) {
          iVar14 = (int)uVar27;
          uVar21 = 0xfa;
          if (0xfa < iVar14) {
            uVar21 = uVar27;
          }
          if (iVar14 < 0xfa) {
            lVar19 = 0;
            do {
              pHVar25 = pDVar12->mTable[(long)iVar14 + lVar19 + 1];
              lVar26 = lVar19 + 1;
              if (pHVar25 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0) break;
              bVar29 = ~(long)iVar14 + uVar21 != lVar19;
              lVar19 = lVar26;
            } while (bVar29);
            uVar27 = (ulong)(uint)(iVar14 + (int)lVar26);
          }
        }
      } while (pHVar25 != (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x0);
    }
    context = local_f8;
    local_c0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    if ((local_c0.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_c0.isTemp == false)) {
      plVar1 = &((local_c0.ds)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_c0.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_c0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    }
  }
  else if (local_d0[0] == List) {
    if ((StringStorage *)local_d0._8_8_ == (StringStorage *)0x0) {
      pp_Var16 = (_func_int **)0x0;
    }
    else {
      *(long *)(local_d0._8_8_ + 8) = *(long *)(local_d0._8_8_ + 8) + 1;
      pp_Var16 = ((RefCountedStorage *)(local_d0._8_8_ + 0x20))->_vptr_RefCountedStorage;
    }
    if (local_f0[0] == Null) {
      lVar19 = -1;
    }
    else {
      iVar13 = Value::IntValue((Value *)local_f0);
      lVar19 = (long)iVar13;
    }
    pp_Var24 = (_func_int **)0x0;
    if (lVar19 < -1) {
      pp_Var24 = pp_Var16;
    }
    lVar26 = (long)pp_Var24 + lVar19;
    if ((lVar26 < -1) || ((long)pp_Var16 <= lVar26)) {
      IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
      pLVar10 = IntrinsicResult::Null;
      (context->code).ls = IntrinsicResult::Null;
      if (pLVar10 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar1 = &(pLVar10->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
    }
    else {
      lVar19 = ((long)pp_Var24 + lVar19) * 0x10 + 0x10;
      local_f8 = context;
      do {
        context = local_f8;
        lVar3 = lVar26 + 1;
        if ((long)pp_Var16 <= lVar3) {
          if ((StringStorage *)uVar11 != (StringStorage *)0x0) {
            plVar1 = (long *)(uVar11 + 8);
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*((RefCountedStorage *)uVar11)->_vptr_RefCountedStorage[1])(uVar11);
            }
          }
          goto LAB_00150200;
        }
        if ((StringStorage *)uVar11 == (StringStorage *)0x0) {
          _Error("Assert failed: ls",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                 ,0x3b);
        }
        if ((lVar26 < -1) ||
           ((long)((RefCountedStorage *)(uVar11 + 0x20))->_vptr_RefCountedStorage <= lVar3)) {
          _Error("invalid index in SimpleVector::operator[]",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0xc1);
          pVVar23 = (Value *)((RefCountedStorage *)(uVar11 + 0x10))->refCount;
        }
        else {
          pVVar23 = (Value *)(((RefCountedStorage *)(uVar11 + 0x10))->refCount + lVar19);
        }
        dVar30 = Value::Equality(pVVar23,&local_98,0x10);
        context = local_f8;
        lVar19 = lVar19 + 0x10;
        lVar26 = lVar3;
      } while ((dVar30 != 1.0) || (NAN(dVar30)));
      local_38 = (long *)(double)lVar3;
      local_40.tempNum._0_2_ = 1;
      local_40.tempNum._2_1_ = 0;
      ((RefCountedStorage *)&local_f8->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)local_f8);
      Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3)
                       ,(Value *)&local_40);
      *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((2 < (byte)local_40.tempNum._0_1_) && (local_38 != (long *)0x0)) {
        plVar1 = local_38 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*local_38 + 8))();
        }
        local_38 = (long *)0x0;
      }
    }
    if ((StringStorage *)uVar11 != (StringStorage *)0x0) {
      plVar1 = (long *)(uVar11 + 8);
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)uVar11)->_vptr_RefCountedStorage[1])(uVar11);
      }
    }
    goto LAB_00150220;
  }
LAB_00150200:
  IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
  pLVar10 = IntrinsicResult::Null;
  ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage =
       (_func_int **)IntrinsicResult::Null;
  if (pLVar10 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar1 = &(pLVar10->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
LAB_00150220:
  if ((Temp < local_f0[0]) && (local_e8.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_e8.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_e8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_e8.number = 0.0;
  }
  if ((Temp < local_98.type) && (local_98.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_98.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_98.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_98.data.number = 0.0;
  }
  if ((Temp < local_d0[0]) && ((StringStorage *)local_d0._8_8_ != (StringStorage *)0x0)) {
    plVar1 = (long *)(local_d0._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((RefCountedStorage *)local_d0._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_indexOf(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value value = context->GetVar("value");
		Value after = context->GetVar("after");
		if (self.type == ValueType::List) {
			ValueList list = self.GetList();
			long count = list.Count();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += count;
			if (afterIdx < -1 || afterIdx > count-1) return IntrinsicResult::Null;
			for (long i=afterIdx+1; i<count; i++) {
				if (Value::Equality(list[i], value) == 1) return IntrinsicResult(i);
			}
		} else if (self.type == ValueType::String) {
			String str = self.GetString();
			String s = value.ToString();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += str.Length();
			long idx = str.IndexOf(s, afterIdx+1);
			if (idx >= 0) return IntrinsicResult(idx);
		} else if (self.type == ValueType::Map) {
			ValueDict dict = self.GetDict();
			bool sawAfter = after.IsNull();
			for (ValueDictIterator kv = dict.GetIterator(); !kv.Done(); kv.Next()) {
				if (!sawAfter) {
					if (Value::Equality(kv.Key(), after) == 1) sawAfter = true;
				} else {
					if (Value::Equality(kv.Value(), value) == 1) return IntrinsicResult(kv.Key());
    			}
			}
		}
		return IntrinsicResult::Null;
	}